

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

void duckdb::BitpackingPrimitives::PackBuffer<unsigned_char,false>
               (data_ptr_t dst,uchar *src,idx_t count,bitpacking_width_t width)

{
  undefined3 in_register_00000009;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uchar local_58 [40];
  
  uVar3 = count & 0xffffffffffffffe0;
  uVar2 = 0;
  for (uVar1 = 0; uVar1 < uVar3; uVar1 = uVar1 + 0x20) {
    PackGroup<unsigned_char>(dst + (uVar2 >> 3),src + uVar1,width);
    uVar2 = uVar2 + (CONCAT31(in_register_00000009,width) << 5);
  }
  uVar1 = count & 0x1f;
  if (uVar1 != 0) {
    switchD_016d8eb1::default(local_58 + uVar1,0,0x20 - uVar1);
    switchD_016b45db::default(local_58,src + uVar3,uVar1);
    PackGroup<unsigned_char>
              (dst + (CONCAT31(in_register_00000009,width) * uVar3 >> 3),local_58,width);
  }
  return;
}

Assistant:

inline static void PackBuffer(data_ptr_t dst, T *src, idx_t count, bitpacking_width_t width) {
		if (ASSUME_INPUT_ALIGNED) {
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}
		} else {
			idx_t misaligned_count = count % BITPACKING_ALGORITHM_GROUP_SIZE;
			count -= misaligned_count;
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}

			// The input is not aligned to BITPACKING_ALGORITHM_GROUP_SIZE.
			// Copy the unaligned count into a zero-initialized temporary group, and pack it.
			if (misaligned_count) {
				T tmp_buffer[BITPACKING_ALGORITHM_GROUP_SIZE] = {0};
				memcpy(tmp_buffer, src + count, misaligned_count * sizeof(T));
				PackGroup<T>(dst + (count * width) / 8, tmp_buffer, width);
			}
		}
	}